

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi_port_client.cpp
# Opt level: O2

int main(void)

{
  allocator local_39;
  CppNet net;
  undefined1 local_28 [24];
  code *local_10;
  
  net._cppnet_base.super___shared_ptr<cppnet::CppNetBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  net._cppnet_base.super___shared_ptr<cppnet::CppNetBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  cppnet::CppNet::Init(&net,1);
  local_28._8_8_ = 0;
  local_28._0_8_ = ConnectFunc;
  local_10 = std::
             _Function_handler<void_(std::shared_ptr<cppnet::CNSocket>,_unsigned_int),_void_(*)(std::shared_ptr<cppnet::CNSocket>,_unsigned_int)>
             ::_M_invoke;
  local_28._16_8_ =
       std::
       _Function_handler<void_(std::shared_ptr<cppnet::CNSocket>,_unsigned_int),_void_(*)(std::shared_ptr<cppnet::CNSocket>,_unsigned_int)>
       ::_M_manager;
  cppnet::CppNet::SetConnectionCallback(&net,(connect_call_back *)local_28);
  std::_Function_base::~_Function_base((_Function_base *)local_28);
  std::__cxx11::string::string((string *)local_28,"127.0.0.1",&local_39);
  cppnet::CppNet::Connection(&net,(string *)local_28,0x22d9);
  std::__cxx11::string::~string((string *)local_28);
  std::__cxx11::string::string((string *)local_28,"127.0.0.1",&local_39);
  cppnet::CppNet::Connection(&net,(string *)local_28,0x22da);
  std::__cxx11::string::~string((string *)local_28);
  cppnet::Sleep(2000);
  cppnet::CppNet::~CppNet(&net);
  return 0;
}

Assistant:

int main() {

    cppnet::CppNet net;
    net.Init(1);
    net.SetConnectionCallback(ConnectFunc);

    net.Connection("127.0.0.1", 8921);
    net.Connection("127.0.0.1", 8922);

    Sleep(2000);
}